

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O1

LY_ERR lysp_stmt_deviation(lysp_ctx *ctx,lysp_stmt *stmt,lysp_deviation **deviations)

{
  ly_stmt stmt_00;
  lysp_deviation *plVar1;
  lysp_ext_instance *plVar2;
  long lVar3;
  yang_arg arg;
  LY_ERR LVar4;
  long *plVar5;
  char *pcVar6;
  char *pcVar7;
  lysp_ext_instance **exts;
  uint32_t substmt_index;
  lysp_deviate **extraout_RDX;
  lysp_deviate **extraout_RDX_00;
  lysp_deviate **extraout_RDX_01;
  lysp_deviate **devs;
  ly_ctx *plVar8;
  lysp_stmt *stmt_01;
  lysp_ext_instance **in_R9;
  lysp_stmt *stmt_02;
  
  plVar1 = *deviations;
  if (plVar1 == (lysp_deviation *)0x0) {
    plVar5 = (long *)malloc(0x30);
    if (plVar5 != (long *)0x0) {
      *plVar5 = 1;
      goto LAB_0016e72c;
    }
  }
  else {
    plVar2 = plVar1[-1].exts;
    plVar1[-1].exts = (lysp_ext_instance *)((long)&plVar2->name + 1);
    plVar5 = (long *)realloc(&plVar1[-1].exts,(long)plVar2 * 0x28 + 0x30);
    if (plVar5 != (long *)0x0) {
LAB_0016e72c:
      *deviations = (lysp_deviation *)(plVar5 + 1);
      lVar3 = *plVar5;
      plVar5[lVar3 * 5 + -2] = 0;
      (plVar5 + lVar3 * 5 + -2)[1] = 0;
      plVar5[lVar3 * 5 + -4] = 0;
      (plVar5 + lVar3 * 5 + -4)[1] = 0;
      plVar5[lVar3 * 5] = 0;
      LVar4 = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
      if (LVar4 != LY_SUCCESS) {
        return LVar4 + (LVar4 == LY_SUCCESS);
      }
      exts = (lysp_ext_instance **)(plVar5 + lVar3 * 5 + -4);
      if (ctx == (lysp_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      stmt_01 = (lysp_stmt *)stmt->arg;
      LVar4 = lydict_insert(plVar8,(char *)stmt_01,0,(char **)exts);
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
      stmt_02 = stmt->child;
      if (stmt_02 == (lysp_stmt *)0x0) {
        return LY_SUCCESS;
      }
      arg = (yang_arg)(plVar5 + lVar3 * 5);
      devs = extraout_RDX;
      do {
        stmt_00 = stmt_02->kw;
        if ((int)stmt_00 < 0xf0000) {
          substmt_index = arg - 0x18;
          if (stmt_00 != LY_STMT_DESCRIPTION) {
            if (stmt_00 == LY_STMT_DEVIATE) {
              lysp_stmt_deviate(ctx,stmt_01,devs,exts);
              return LY_EINVAL;
            }
LAB_0016e8ce:
            if (ctx == (lysp_ctx *)0x0) {
              plVar8 = (ly_ctx *)0x0;
            }
            else {
              plVar8 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            pcVar6 = lyplg_ext_stmt2str(stmt_00);
            pcVar7 = lyplg_ext_stmt2str(LY_STMT_DEVIATION);
            ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\".",pcVar6,pcVar7);
            return LY_EVALID;
          }
LAB_0016e873:
          exts = (lysp_ext_instance **)0x2;
          stmt_01 = stmt_02;
          LVar4 = lysp_stmt_text_field(ctx,stmt_02,substmt_index,(char **)0x2,arg,in_R9);
          devs = extraout_RDX_00;
        }
        else {
          if (stmt_00 != LY_STMT_EXTENSION_INSTANCE) {
            substmt_index = arg - 0x10;
            if (stmt_00 != LY_STMT_REFERENCE) goto LAB_0016e8ce;
            goto LAB_0016e873;
          }
          exts = (lysp_ext_instance **)0x0;
          stmt_01 = stmt_02;
          LVar4 = lysp_stmt_ext(ctx,stmt_02,stmt->kw,0,(lysp_ext_instance **)(plVar5 + lVar3 * 5));
          devs = extraout_RDX_01;
        }
        if (LVar4 != LY_SUCCESS) {
          return LVar4;
        }
        stmt_02 = stmt_02->next;
        if (stmt_02 == (lysp_stmt *)0x0) {
          return LY_SUCCESS;
        }
      } while( true );
    }
    (*deviations)[-1].exts = (lysp_ext_instance *)((long)&(*deviations)[-1].exts[-1].exts + 7);
  }
  if (ctx == (lysp_ctx *)0x0) {
    plVar8 = (ly_ctx *)0x0;
  }
  else {
    plVar8 = (ly_ctx *)
             **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  ly_log(plVar8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_deviation");
  return LY_EMEM;
}

Assistant:

static LY_ERR
lysp_stmt_deviation(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_deviation **deviations)
{
    struct lysp_deviation *dev;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *deviations, dev, LY_EMEM);

    /* store nodeid */
    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_STR_ARG, stmt->arg));
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &dev->nodeid));

    /* parse substatements */
    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &dev->dsc, Y_STR_ARG, &dev->exts));
            break;
        case LY_STMT_DEVIATE:
            LY_CHECK_RET(lysp_stmt_deviate(ctx, child, &dev->deviates, &dev->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &dev->ref, Y_STR_ARG, &dev->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, stmt->kw, 0, &dev->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), lyplg_ext_stmt2str(LY_STMT_DEVIATION));
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}